

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_div(sexp ctx,sexp a,sexp b)

{
  int iVar1;
  int iVar2;
  sexp psVar3;
  double dVar4;
  sexp tmp;
  double local_38;
  sexp_gc_var_t local_30;
  
  iVar1 = sexp_number_type(a);
  iVar2 = sexp_number_type(b);
  local_30.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  psVar3 = (sexp)&DAT_0000043e;
  switch(iVar1 * 6 + iVar2) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
    b = a;
    goto LAB_0011a19d;
  case 6:
  case 0xc:
  case 0x12:
  case 0x18:
LAB_0011a19d:
    psVar3 = sexp_type_exception(ctx,(sexp)0x0,3,b);
    break;
  case 7:
  case 9:
  case 0x13:
  case 0x15:
    tmp = sexp_make_ratio(ctx,a,b);
    psVar3 = sexp_ratio_normalize(ctx,tmp,(sexp)&DAT_0000003e);
    break;
  case 8:
    dVar4 = (double)((long)a >> 1);
    goto LAB_0011a2d9;
  case 0xd:
    dVar4 = (a->value).flonum / (double)((long)b >> 1);
    goto LAB_0011a30c;
  case 0xe:
    dVar4 = (a->value).flonum;
    goto LAB_0011a2d9;
  case 0xf:
    local_38 = (a->value).flonum;
    dVar4 = sexp_bignum_to_double(b);
    goto LAB_0011a2fb;
  case 0x10:
    local_38 = (a->value).flonum;
    dVar4 = sexp_ratio_to_double(ctx,b);
LAB_0011a2fb:
    dVar4 = local_38 / dVar4;
    goto LAB_0011a30c;
  case 0x14:
    dVar4 = sexp_bignum_to_double(a);
    goto LAB_0011a2d9;
  case 0x19:
  case 0x1b:
    b = sexp_make_ratio(ctx,b,(sexp)&DAT_00000003);
    tmp = b;
  case 10:
  case 0x16:
    if ((((ulong)a & 3) != 0) || (a->tag != 0xd)) {
      a = sexp_make_ratio(ctx,a,(sexp)&DAT_00000003);
      tmp = a;
    }
  case 0x1c:
    psVar3 = sexp_ratio_div(ctx,a,b);
    break;
  case 0x1a:
    dVar4 = sexp_ratio_to_double(ctx,a);
LAB_0011a2d9:
    dVar4 = dVar4 / (b->value).flonum;
LAB_0011a30c:
    psVar3 = sexp_make_flonum(ctx,dVar4);
    break;
  case 0x22:
    dVar4 = sexp_ratio_to_double(ctx,b);
    b = sexp_make_flonum(ctx,dVar4);
    tmp = b;
  case 0x1f:
  case 0x20:
  case 0x21:
    b = sexp_make_complex(ctx,b,(sexp)&DAT_00000001);
    tmp = b;
  case 0x1d:
    if ((((ulong)a & 3) == 0) && (a->tag == 0xd)) {
      dVar4 = sexp_ratio_to_double(ctx,a);
      a = sexp_make_flonum(ctx,dVar4);
      tmp = a;
    }
  case 0xb:
  case 0x11:
  case 0x17:
    if ((((ulong)a & 3) != 0) || (a->tag != 0xe)) {
      a = sexp_make_complex(ctx,a,(sexp)&DAT_00000001);
      tmp = a;
    }
  case 0x23:
    psVar3 = sexp_complex_div(ctx,a,b);
  }
  (ctx->value).context.saves = local_30.next;
  return psVar3;
}

Assistant:

sexp sexp_div (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
#if ! SEXP_USE_RATIOS
  double f;
#endif
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_NOT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, b);
    break;
  case SEXP_NUM_FIX_FIX:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    f = sexp_fixnum_to_double(a) / sexp_fixnum_to_double(b);
    r = ((f == trunc(f)) ? sexp_make_fixnum((sexp_sint_t)f)
         : sexp_make_flonum(ctx, f));
#endif
    break;
  case SEXP_NUM_FIX_FLO:
    r = sexp_make_flonum(ctx, sexp_fixnum_to_double(a)/sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    r = sexp_make_flonum(ctx, sexp_fixnum_to_double(a)/sexp_bignum_to_double(b));
#endif
    break;
  case SEXP_NUM_FLO_FIX:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a)/sexp_fixnum_to_double(b));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_div(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) / sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_FIX:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
    break;
#else
    b = tmp = sexp_fixnum_to_bignum(ctx, b);
#endif
    /* ... FALLTHROUGH if ! SEXP_USE_RATIOS ... */
  case SEXP_NUM_BIG_BIG:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    r = sexp_bignum_quot_rem(ctx, &tmp, a, b);
    if (sexp_bignum_normalize(tmp) != SEXP_ZERO)
      r = sexp_make_flonum(ctx, sexp_bignum_to_double(a)
                           / sexp_bignum_to_double(b));
    else
      r = sexp_bignum_normalize(r);
#endif
    break;
  case SEXP_NUM_BIG_FLO:
    r = sexp_make_flonum(ctx, sexp_bignum_to_double(a) / sexp_flonum_value(b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) / sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_RAT_FLO:
    r = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a) / sexp_flonum_value(b));
    break;
  case SEXP_NUM_RAT_FIX:
  case SEXP_NUM_RAT_BIG:
    b = tmp = sexp_make_ratio(ctx, b, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    if (!sexp_ratiop(a))
      a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_div(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_CPX_RAT:
    b = tmp = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, b));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_FIX:
  case SEXP_NUM_CPX_BIG:
    b = tmp = sexp_make_complex(ctx, b, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
    if (sexp_ratiop(a))
      a = tmp = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    if (!sexp_complexp(a))
      a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_div(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}